

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

sexp_conflict
sexp_signal_mask_set_x_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1)

{
  int iVar1;
  sexp_conflict psVar2;
  
  if (((ulong)arg1 & 3) != 0) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,(long)(self->value).type.print >> 1);
    return psVar2;
  }
  if ((long)(self->value).type.print >> 1 == (ulong)arg1->tag) {
    iVar1 = sigprocmask(2,(sigset_t *)(arg1->value).type.slots,(sigset_t *)0x0);
    return (sexp_conflict)((ulong)(iVar1 == 0) << 8 | 0x3e);
  }
  psVar2 = (sexp_conflict)sexp_type_exception();
  return psVar2;
}

Assistant:

sexp sexp_signal_mask_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1) {
  int err = 0;
  sexp res;
  if (! (sexp_pointerp(arg1) && (sexp_pointer_tag(arg1) == sexp_unbox_fixnum(sexp_opcode_arg2_type(self)))))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), arg1);
  err = sigprocmask(SIG_SETMASK, (sigset_t*)sexp_cpointer_value(arg1), NULL);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}